

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O0

void build_chk2_cmp2(m68k_info *info,int size)

{
  uint instruction;
  cs_m68k *op;
  int iVar1;
  long in_RDI;
  uint extension;
  cs_m68k *ext;
  cs_m68k_op *op1;
  cs_m68k_op *op0;
  uint in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  undefined8 in_stack_ffffffffffffffd8;
  m68k_info *in_stack_ffffffffffffffe0;
  m68k_info *info_00;
  
  op = build_init_op(in_stack_ffffffffffffffe0,(int)((ulong)in_stack_ffffffffffffffd8 >> 0x20),
                     (int)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4);
  instruction = read_imm_16((m68k_info *)
                            CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  if ((instruction & 0x800) == 0) {
    MCInst_setOpcode(*(MCInst **)(in_RDI + 0x18),0x34);
  }
  else {
    MCInst_setOpcode(*(MCInst **)(in_RDI + 0x18),0x2e);
  }
  info_00 = (m68k_info *)(op->operands + 1);
  get_ea_mode_op(info_00,op->operands,instruction,in_stack_ffffffffffffffd0);
  (info_00->extension).operands[0].field_0.reg_pair.reg_1 = M68K_REG_INVALID;
  (info_00->extension).operands[0].field_0.simm = 1.4013e-45;
  iVar1 = 1;
  if ((instruction & 0x8000) != 0) {
    iVar1 = 9;
  }
  *(uint *)&info_00->code = iVar1 + (instruction >> 0xc & 7);
  return;
}

Assistant:

static void build_chk2_cmp2(m68k_info *info, int size)
{
	cs_m68k_op* op0;
	cs_m68k_op* op1;
	cs_m68k* ext = build_init_op(info, M68K_INS_CHK2, 2, size);

	uint extension = read_imm_16(info);

	if (BIT_B(extension))
		MCInst_setOpcode(info->inst, M68K_INS_CHK2);
	else
		MCInst_setOpcode(info->inst, M68K_INS_CMP2);

	op0 = &ext->operands[0];
	op1 = &ext->operands[1];

	get_ea_mode_op(info, op0, info->ir, size);

	op1->address_mode = M68K_AM_NONE;
	op1->type = M68K_OP_REG;
	op1->reg = (BIT_F(extension) ? M68K_REG_A0 : M68K_REG_D0) + ((extension >> 12) & 7);
}